

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNormalizer.cpp
# Opt level: O0

DOMNode * __thiscall xercesc_4_0::DOMNormalizer::normalizeNode(DOMNormalizer *this,DOMNode *node)

{
  DOMDocumentImpl *pDVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  DOMNode *pDVar5;
  undefined8 uVar6;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  XMLCh *nv;
  DOMNode *next_1;
  DOMNode *prevSibling_1;
  DOMNode *parent_1;
  DOMText *text;
  DOMNode *nextSibling;
  DOMNode *parent;
  DOMNode *prevSibling;
  DOMNode *next;
  DOMNode *child;
  XMLSize_t i;
  DOMNamedNodeMap *attrMap;
  DOMNode *node_local;
  DOMNormalizer *this_local;
  undefined4 extraout_var;
  
  iVar2 = (*node->_vptr_DOMNode[4])();
  switch(iVar2) {
  case 1:
    InScopeNamespaces::addScope(this->fNSScope,this->fMemoryManager);
    iVar2 = (*node->_vptr_DOMNode[0xb])();
    plVar3 = (long *)CONCAT44(extraout_var,iVar2);
    if ((this->fConfiguration->featureValues & 0x80) == 0) {
      if (plVar3 != (long *)0x0) {
        for (child = (DOMNode *)0x0; pDVar5 = (DOMNode *)(**(code **)(*plVar3 + 0x28))(),
            child < pDVar5; child = (DOMNode *)((long)&child->_vptr_DOMNode + 1)) {
          plVar4 = (long *)(**(code **)(*plVar3 + 0x18))(plVar3,child);
          (**(code **)(*plVar4 + 0xa0))();
        }
      }
    }
    else {
      namespaceFixUp(this,(DOMElementImpl *)node);
    }
    iVar2 = (*node->_vptr_DOMNode[7])();
    next = (DOMNode *)CONCAT44(extraout_var_00,iVar2);
    while (next != (DOMNode *)0x0) {
      iVar2 = (*next->_vptr_DOMNode[10])();
      pDVar5 = normalizeNode(this,next);
      prevSibling = (DOMNode *)CONCAT44(extraout_var_01,iVar2);
      if (pDVar5 != (DOMNode *)0x0) {
        prevSibling = pDVar5;
      }
      next = prevSibling;
    }
    InScopeNamespaces::removeScope(this->fNSScope);
    break;
  case 3:
    iVar2 = (*node->_vptr_DOMNode[10])();
    plVar3 = (long *)CONCAT44(extraout_var_08,iVar2);
    if ((plVar3 != (long *)0x0) && (iVar2 = (**(code **)(*plVar3 + 0x20))(), iVar2 == 3)) {
      uVar6 = (**(code **)(*plVar3 + 0x18))();
      (*node->_vptr_DOMNode[0x2b])(node,uVar6);
      iVar2 = (*node->_vptr_DOMNode[5])();
      (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar2) + 0x80))
                ((long *)CONCAT44(extraout_var_09,iVar2),plVar3);
      return node;
    }
    iVar2 = (*node->_vptr_DOMNode[3])();
    if (((short *)CONCAT44(extraout_var_10,iVar2) == (short *)0x0) ||
       (*(short *)CONCAT44(extraout_var_10,iVar2) == 0)) {
      iVar2 = (*node->_vptr_DOMNode[5])();
      (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar2) + 0x80))
                ((long *)CONCAT44(extraout_var_11,iVar2),node);
    }
  default:
    break;
  case 4:
    if ((this->fConfiguration->featureValues & 2) == 0) {
      pDVar1 = this->fDocument;
      iVar2 = (*node->_vptr_DOMNode[3])();
      iVar2 = (*(pDVar1->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x3e])
                        (pDVar1,CONCAT44(extraout_var_04,iVar2));
      pDVar5 = (DOMNode *)CONCAT44(extraout_var_05,iVar2);
      iVar2 = (*node->_vptr_DOMNode[5])();
      plVar3 = (long *)CONCAT44(extraout_var_06,iVar2);
      iVar2 = (*node->_vptr_DOMNode[9])();
      plVar4 = (long *)CONCAT44(extraout_var_07,iVar2);
      (**(code **)(*plVar3 + 0x78))(plVar3,pDVar5,node);
      if (plVar4 == (long *)0x0) {
        return pDVar5;
      }
      iVar2 = (**(code **)(*plVar4 + 0x20))();
      if (iVar2 != 3) {
        return pDVar5;
      }
      uVar6 = (**(code **)(*plVar4 + 0x18))();
      (*pDVar5->_vptr_DOMNode[0x2c])(pDVar5,0,uVar6);
      (**(code **)(*plVar3 + 0x80))(plVar3,plVar4);
      return pDVar5;
    }
    break;
  case 8:
    if ((this->fConfiguration->featureValues & 4) == 0) {
      iVar2 = (*node->_vptr_DOMNode[9])();
      plVar3 = (long *)CONCAT44(extraout_var_02,iVar2);
      iVar2 = (*node->_vptr_DOMNode[5])();
      plVar4 = (long *)CONCAT44(extraout_var_03,iVar2);
      (**(code **)(*plVar4 + 0x80))(plVar4,node);
      if ((((plVar3 != (long *)0x0) && (iVar2 = (**(code **)(*plVar3 + 0x20))(), iVar2 == 3)) &&
          (pDVar5 = (DOMNode *)(**(code **)(*plVar3 + 0x50))(), pDVar5 != (DOMNode *)0x0)) &&
         (iVar2 = (*pDVar5->_vptr_DOMNode[4])(), iVar2 == 3)) {
        uVar6 = (**(code **)(*plVar3 + 0x18))();
        (*pDVar5->_vptr_DOMNode[0x2c])(pDVar5,0,uVar6);
        (**(code **)(*plVar4 + 0x80))(plVar4,plVar3);
        return pDVar5;
      }
    }
  }
  return (DOMNode *)0x0;
}

Assistant:

DOMNode * DOMNormalizer::normalizeNode(DOMNode *node) const {
    switch(node->getNodeType()) {
    case DOMNode::ELEMENT_NODE: {
        fNSScope->addScope(fMemoryManager);
        DOMNamedNodeMap *attrMap = node->getAttributes();

        if(fConfiguration->featureValues & DOMConfigurationImpl::FEATURE_NAMESPACES) {
            namespaceFixUp((DOMElementImpl*)node);
        }
        else {
            //this is done in namespace fixup so no need to do it if namespace is on
            if(attrMap) {
                for(XMLSize_t i = 0; i < attrMap->getLength(); i++) {
                    attrMap->item(i)->normalize();
                }
            }
        }

        DOMNode *child = node->getFirstChild();
        DOMNode *next = 0;
        for (; child != 0; child = next) {
            next = child->getNextSibling();
            child = normalizeNode(child);
            if(child != 0) {
                next = child;
            }
        }
        fNSScope->removeScope();
        break;
    }
    case DOMNode::COMMENT_NODE: {
        if (!(fConfiguration->featureValues & DOMConfigurationImpl::FEATURE_COMMENTS)) {
            DOMNode *prevSibling = node->getPreviousSibling();
            DOMNode *parent = node->getParentNode();
            // remove the comment node
            parent->removeChild(node);
            if (prevSibling != 0 && prevSibling->getNodeType() == DOMNode::TEXT_NODE) {
                DOMNode *nextSibling = prevSibling->getNextSibling();
                if (nextSibling != 0 && nextSibling->getNodeType() == DOMNode::TEXT_NODE) {
                    ((DOMTextImpl*)nextSibling)->insertData(0, prevSibling->getNodeValue());
                    parent->removeChild(prevSibling);
                    return nextSibling;
                }
            }
        }
        break;
    }
    case DOMNode::CDATA_SECTION_NODE: {
        if (!(fConfiguration->featureValues & DOMConfigurationImpl::FEATURE_CDATA_SECTIONS)) {
            // convert CDATA to TEXT nodes
            DOMText *text = fDocument->createTextNode(node->getNodeValue());
            DOMNode *parent = node->getParentNode();
            DOMNode *prevSibling = node->getPreviousSibling();
            node = parent->replaceChild(text, node);
            if (prevSibling != 0 && prevSibling->getNodeType() == DOMNode::TEXT_NODE) {
                text->insertData(0, prevSibling->getNodeValue());
                parent->removeChild(prevSibling);
            }
            return text; // Don't advance;
        }
        break;
    }
    case DOMNode::TEXT_NODE: {
        DOMNode *next = node->getNextSibling();

        if(next != 0 && next->getNodeType() == DOMNode::TEXT_NODE) {
            ((DOMText*)node)->appendData(next->getNodeValue());
            node->getParentNode()->removeChild(next);
            return node;
        } else {
            const XMLCh* nv = node->getNodeValue();
            if (nv == 0 || *nv == 0) {
                node->getParentNode()->removeChild(node);
            }
        }
    }
    default:
        break;
    }

    return 0;
}